

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

void ctype_preptype(CTRepr *ctr,CType *ct,CTInfo qual,char *t)

{
  ulong uVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  
  uVar4 = (ulong)(ct->name).gcptr32;
  if (uVar4 == 0) {
    pcVar7 = ctr->pb;
    if (ctr->needsp != 0) {
      if (ctr->buf < pcVar7) {
        ctr->pb = pcVar7 + -1;
        pcVar7[-1] = ' ';
        pcVar7 = ctr->pb;
      }
      else {
        ctr->ok = 0;
      }
    }
    if (pcVar7 < ctr->buf + 0xb) {
      ctr->ok = 0;
    }
    else {
      uVar4 = (ulong)((long)ct - (long)ctr->cts->tab) >> 4;
      do {
        uVar3 = (uint)uVar4;
        pcVar7[-1] = (char)uVar4 + (char)((uVar4 & 0xffffffff) / 10) * -10 | 0x30;
        pcVar7 = pcVar7 + -1;
        uVar4 = (uVar4 & 0xffffffff) / 10;
      } while (9 < uVar3);
      ctr->pb = pcVar7;
    }
    ctr->needsp = 1;
  }
  else {
    uVar1 = (ulong)*(uint *)(uVar4 + 0xc);
    pcVar7 = ctr->pb;
    if (pcVar7 < ctr->buf + uVar1 + 1) {
      ctr->ok = 0;
    }
    else {
      pcVar6 = pcVar7;
      if (ctr->needsp != 0) {
        pcVar7[-1] = ' ';
        pcVar6 = pcVar7 + -1;
      }
      ctr->needsp = 1;
      pcVar7 = pcVar6 + -uVar1;
      if (uVar1 != 0) {
        lVar5 = 0;
        do {
          pcVar6[lVar5 + -1] = *(char *)(uVar4 + uVar1 + 0xf + lVar5);
          lVar5 = lVar5 + -1;
        } while (-lVar5 != uVar1);
      }
      ctr->pb = pcVar7;
    }
  }
  sVar2 = strlen(t);
  uVar4 = sVar2 & 0xffffffff;
  if (pcVar7 < ctr->buf + uVar4 + 1) {
    ctr->ok = 0;
  }
  else {
    if (ctr->needsp != 0) {
      pcVar7[-1] = ' ';
      pcVar7 = pcVar7 + -1;
    }
    ctr->needsp = 1;
    if (uVar4 != 0) {
      lVar5 = 0;
      do {
        pcVar7[lVar5 + -1] = t[lVar5 + (uVar4 - 1)];
        lVar5 = lVar5 + -1;
      } while (-lVar5 != uVar4);
    }
    ctr->pb = pcVar7 + -uVar4;
  }
  ctype_prepqual(ctr,qual);
  return;
}

Assistant:

static void ctype_preptype(CTRepr *ctr, CType *ct, CTInfo qual, const char *t)
{
  if (gcref(ct->name)) {
    GCstr *str = gco2str(gcref(ct->name));
    ctype_prepstr(ctr, strdata(str), str->len);
  } else {
    if (ctr->needsp) ctype_prepc(ctr, ' ');
    ctype_prepnum(ctr, ctype_typeid(ctr->cts, ct));
    ctr->needsp = 1;
  }
  ctype_prepstr(ctr, t, (MSize)strlen(t));
  ctype_prepqual(ctr, qual);
}